

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

l_mem luaO_applyparam(lu_byte p,l_mem x)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  undefined3 in_register_00000039;
  
  uVar1 = (p & 0xf) + 0x10;
  if (p < 0x10) {
    uVar1 = p & 0xf;
  }
  iVar3 = -7;
  if (p >= 0x10) {
    iVar3 = (CONCAT31(in_register_00000039,p) >> 4) - 8;
  }
  bVar2 = (byte)iVar3;
  if (iVar3 < 0) {
    if (x < 0x421084210842108) {
      return (long)((ulong)uVar1 * x) >> (-bVar2 & 0x3f);
    }
    uVar4 = (ulong)x >> (-bVar2 & 0x3f);
    if (uVar4 < 0x421084210842108) {
      return uVar4 * uVar1;
    }
  }
  else if (x < (long)(0x421084210842108U >> (bVar2 & 0x3f))) {
    return (ulong)uVar1 * x << (bVar2 & 0x3f);
  }
  return 0x7fffffffffffffff;
}

Assistant:

l_mem luaO_applyparam (lu_byte p, l_mem x) {
  unsigned int m = p & 0xF;  /* mantissa */
  int e = (p >> 4);  /* exponent */
  if (e > 0) {  /* normalized? */
    e--;  /* correct exponent */
    m += 0x10;  /* correct mantissa; maximum value is 0x1F */
  }
  e -= 7;  /* correct excess-7 */
  if (e >= 0) {
    if (x < (MAX_LMEM / 0x1F) >> e)  /* no overflow? */
      return (x * m) << e;  /* order doesn't matter here */
    else  /* real overflow */
      return MAX_LMEM;
  }
  else {  /* negative exponent */
    e = -e;
    if (x < MAX_LMEM / 0x1F)  /* multiplication cannot overflow? */
      return (x * m) >> e;  /* multiplying first gives more precision */
    else if ((x >> e) <  MAX_LMEM / 0x1F)  /* cannot overflow after shift? */
      return (x >> e) * m;
    else  /* real overflow */
      return MAX_LMEM;
  }
}